

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelCase::iterate(TextureLevelCase *this)

{
  int iVar1;
  reference spec;
  size_type sVar2;
  TestLog *log;
  reference pvVar3;
  int local_1b4;
  int local_1b0;
  int ndx;
  undefined1 local_1a0 [8];
  MessageBuilder msg;
  bool result;
  TextureLevelCase *this_local;
  
  spec = std::
         vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
         ::operator[](&this->m_iterations,(long)this->m_iteration);
  msg._383_1_ = testConfig(this,spec);
  if (!(bool)msg._383_1_) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_failedIterations,&this->m_iteration);
    this->m_allIterationsOk = false;
  }
  iVar1 = this->m_iteration + 1;
  this->m_iteration = iVar1;
  sVar2 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
          ::size(&this->m_iterations);
  if (iVar1 < (int)sVar2) {
    this_local._4_4_ = CONTINUE;
  }
  else {
    if ((this->m_allIterationsOk & 1U) == 0) {
      log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
      ;
      tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_1a0,log);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(char (*) [32])"Following iteration(s) failed: ");
      local_1b0 = 0;
      while( true ) {
        iVar1 = local_1b0;
        sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->m_failedIterations);
        if ((int)sVar2 <= iVar1) break;
        if (local_1b0 != 0) {
          tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,(char (*) [3])0xf95514);
        }
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_failedIterations,(long)local_1b0);
        local_1b4 = *pvVar3 + 1;
        tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&local_1b4);
        local_1b0 = local_1b0 + 1;
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "One or more iterations failed");
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1a0);
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

TextureLevelCase::IterateResult TextureLevelCase::iterate (void)
{
	const bool result = testConfig(m_iterations[m_iteration]);

	if (!result)
	{
		m_failedIterations.push_back(m_iteration);
		m_allIterationsOk = false;
	}

	if (++m_iteration < (int)m_iterations.size())
		return CONTINUE;

	if (m_allIterationsOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		tcu::MessageBuilder msg(&m_testCtx.getLog());

		msg << "Following iteration(s) failed: ";
		for (int ndx = 0; ndx < (int)m_failedIterations.size(); ++ndx)
		{
			if (ndx)
				msg << ", ";
			msg << (m_failedIterations[ndx] + 1);
		}
		msg << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "One or more iterations failed");
	}
	return STOP;
}